

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerException.cpp
# Opt level: O2

void __thiscall
ninx::lexer::exception::LexerException::LexerException
          (LexerException *this,int line,string *origin,string *message)

{
  string local_40;
  
  make_message(&local_40,line,origin,message);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)this = &PTR__runtime_error_0014ed68;
  this->line = line;
  this->origin = origin;
  return;
}

Assistant:

ninx::lexer::exception::LexerException::LexerException(int line, std::string &origin, const std::string &message)
        : runtime_error(
        make_message(line, origin, message)), line{line}, origin(origin) {

}